

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

int __thiscall embree::XMLWriter::close(XMLWriter *this,int __fd)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  
  this->ident = this->ident - 2;
  tab(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"</");
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(in_register_00000034,__fd));
  poVar2 = std::operator<<(poVar2,">");
  iVar1 = std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return iVar1;
}

Assistant:

void XMLWriter::close(std::string str)
  {
    assert(ident>=2);
    ident-=2;
    tab(); xml << "</" << str << ">" << std::endl;
  }